

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_int,_long_double>::Run
          (DataTransform<unsigned_int,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint input_data;
  string word;
  char buffer [128];
  uint local_2ac;
  string local_2a8;
  string *local_288;
  double local_280;
  double local_278;
  long local_270;
  long local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  long local_248;
  longdouble local_23c;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_288 = &this->print_format_;
  iVar10 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar9 = 2;
        bVar4 = false;
      }
      else {
        piVar5 = __errno_location();
        iVar9 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_2a8);
        if (local_2a8._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_001385a2:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar9;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_001385a2;
        }
        local_248 = (long)ROUND(in_ST0);
        local_2ac = (uint)local_248;
        iVar9 = 0;
        bVar4 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
    }
    else {
      bVar4 = sptk::ReadStream<unsigned_int>(&local_2ac,input_stream);
      iVar9 = 2;
    }
    if (bVar4 != false) {
      local_250 = (ulong)local_2ac;
      lVar11 = (longdouble)local_250;
      lVar12 = this->minimum_value_;
      lVar1 = this->maximum_value_;
      if (lVar1 <= lVar12) {
LAB_0013823f:
        bVar4 = false;
        lVar12 = lVar11;
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          bVar4 = true;
          if ((lVar12 <= lVar11) && (lVar12 = lVar1, lVar11 <= lVar1)) goto LAB_0013823f;
        }
        else if (NVar2 == kUnsignedInteger) {
          lVar13 = (longdouble)9.223372e+18;
          lVar14 = (longdouble)0;
          if (lVar13 <= lVar12) {
            lVar14 = lVar13;
          }
          local_258 = (ulong)ROUND(lVar12 - lVar14);
          bVar4 = true;
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          if (((ulong)(lVar13 <= lVar12) << 0x3f ^ local_258) <= local_250) {
            lVar14 = (longdouble)9.223372e+18;
            lVar12 = (longdouble)0;
            if (lVar14 <= lVar1) {
              lVar12 = lVar14;
            }
            local_260 = (ulong)ROUND(lVar1 - lVar12);
            bVar4 = ((ulong)(lVar14 <= lVar1) << 0x3f ^ local_260) < local_250;
            lVar12 = lVar11;
            if (bVar4) {
              lVar12 = lVar1;
            }
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0013823f;
          local_268 = (long)ROUND(lVar12);
          bVar4 = true;
          in_ST4 = in_ST3;
          if (local_268 <= (long)local_250) {
            local_270 = (long)ROUND(lVar1);
            bVar4 = local_270 < (long)local_250;
            lVar12 = lVar11;
            if (bVar4) {
              lVar12 = lVar1;
            }
          }
        }
      }
      if ((!bVar4) && (this->rounding_ != false)) {
        if (local_250 == 0) {
          local_280 = (double)local_250 + -0.5;
          lVar12 = (longdouble)local_280;
        }
        else {
          local_278 = (double)local_250 + 0.5;
          lVar12 = (longdouble)local_278;
        }
      }
      in_ST5 = in_ST4;
      in_ST6 = in_ST4;
      if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
        local_23c = lVar12;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"th data is over the range of output type",0x28);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"x2x","");
        sptk::PrintErrorMessage(&local_2a8,(ostringstream *)&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        WVar3 = this->warning_type_;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
        std::ios_base::~ios_base(local_1c0);
        iVar9 = 1;
        lVar12 = local_23c;
        if (WVar3 == kExit) goto LAB_001384dd;
      }
      if (this->is_ascii_output_ == true) {
        bVar4 = sptk::SnPrintf<long_double>(lVar12,local_288,0x80,local_b8);
        iVar9 = 1;
        if (bVar4) {
          sVar8 = strlen(local_b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar8);
          if ((iVar10 + 1) % this->num_column_ == 0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          }
LAB_001384d7:
          iVar9 = 0;
        }
      }
      else {
        bVar4 = sptk::WriteStream<long_double>(lVar12,(ostream *)&std::cout);
        iVar9 = 1;
        if (bVar4) goto LAB_001384d7;
      }
    }
LAB_001384dd:
    if (iVar9 != 0) {
      if (iVar9 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar10 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar10 = iVar10 + 1;
    in_ST7 = in_ST6;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }